

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>>::
find<0ul,char_const(&)[4]>
          (Table<kj::StringPtr,kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>> *this,
          char (*params) [7])

{
  long lVar1;
  ArrayPtr<kj::StringPtr> table;
  TreeIndex<kj::_::(anonymous_namespace)::StringCompare> local_28 [8];
  long local_20;
  
  table.ptr = params[4] + 4;
  table.size_ = *(size_t *)params;
  TreeIndex<kj::_::(anonymous_namespace)::StringCompare>::find<kj::StringPtr,char_const(&)[4]>
            (local_28,table,
             (char (*) [7])((long)(*(long *)(params[1] + 1) - *(size_t *)params) >> 4));
  if (local_28[0] == (TreeIndex<kj::_::(anonymous_namespace)::StringCompare>)0x1) {
    lVar1 = local_20 * 0x10 + *(long *)params;
  }
  else {
    lVar1 = 0;
  }
  *(long *)this = lVar1;
  return (Maybe<kj::StringPtr_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}